

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int yaml_parser_parse_node
              (yaml_parser_t *parser,yaml_event_t *event,int block,int indentless_sequence)

{
  yaml_parser_state_t *pyVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  yaml_mark_t context_mark;
  yaml_mark_t context_mark_00;
  yaml_mark_t problem_mark;
  int iVar5;
  uint uVar6;
  size_t __n;
  size_t __n_00;
  yaml_char_t *pyVar7;
  char *context;
  byte local_f1;
  yaml_token_t *local_f0;
  yaml_token_t *local_e8;
  yaml_token_t *local_e0;
  yaml_token_t *local_d8;
  yaml_token_t *local_d0;
  yaml_char_t *value;
  int quoted_implicit;
  int plain_implicit;
  size_t suffix_len;
  size_t prefix_len;
  yaml_tag_directive_t *tag_directive;
  size_t sStack_98;
  int implicit;
  yaml_mark_t tag_mark;
  yaml_mark_t end_mark;
  yaml_mark_t start_mark;
  yaml_char_t *tag;
  yaml_char_t *tag_suffix;
  yaml_char_t *tag_handle;
  yaml_char_t *anchor;
  yaml_token_t *token;
  int indentless_sequence_local;
  int block_local;
  yaml_event_t *event_local;
  yaml_parser_t *parser_local;
  
  tag_handle = (yaml_char_t *)0x0;
  tag_suffix = (yaml_char_t *)0x0;
  tag = (yaml_char_t *)0x0;
  start_mark.column = 0;
  if ((parser->token_available == 0) && (iVar5 = yaml_parser_fetch_more_tokens(parser), iVar5 == 0))
  {
    local_d0 = (yaml_token_t *)0x0;
  }
  else {
    local_d0 = (parser->tokens).head;
  }
  anchor = (yaml_char_t *)local_d0;
  if (local_d0 == (yaml_token_t *)0x0) {
    return 0;
  }
  if (local_d0->type == YAML_ALIAS_TOKEN) {
    pyVar1 = (parser->states).top;
    (parser->states).top = pyVar1 + -1;
    parser->state = pyVar1[-1];
    memset(event,0,0x68);
    event->type = YAML_ALIAS_EVENT;
    (event->start_mark).index = (local_d0->start_mark).index;
    (event->start_mark).line = (local_d0->start_mark).line;
    (event->start_mark).column = (local_d0->start_mark).column;
    (event->end_mark).index = (local_d0->end_mark).index;
    (event->end_mark).line = (local_d0->end_mark).line;
    (event->end_mark).column = (local_d0->end_mark).column;
    (event->data).document_start.version_directive =
         (yaml_version_directive_t *)(local_d0->data).alias.value;
    parser->token_available = 0;
    parser->tokens_parsed = parser->tokens_parsed + 1;
    parser->stream_end_produced = (uint)(((parser->tokens).head)->type == YAML_STREAM_END_TOKEN);
    (parser->tokens).head = (parser->tokens).head + 1;
    return 1;
  }
  tag_mark.column = (local_d0->start_mark).index;
  end_mark.index = (local_d0->start_mark).line;
  end_mark.line = (local_d0->start_mark).column;
  if (local_d0->type == YAML_ANCHOR_TOKEN) {
    tag_handle = (local_d0->data).tag.handle;
    end_mark.column = (local_d0->start_mark).index;
    start_mark.index = (local_d0->start_mark).line;
    start_mark.line = (local_d0->start_mark).column;
    tag_mark.column = (local_d0->end_mark).index;
    end_mark.index = (local_d0->end_mark).line;
    end_mark.line = (local_d0->end_mark).column;
    parser->token_available = 0;
    parser->tokens_parsed = parser->tokens_parsed + 1;
    parser->stream_end_produced = (uint)(((parser->tokens).head)->type == YAML_STREAM_END_TOKEN);
    (parser->tokens).head = (parser->tokens).head + 1;
    if ((parser->token_available == 0) &&
       (iVar5 = yaml_parser_fetch_more_tokens(parser), iVar5 == 0)) {
      local_d8 = (yaml_token_t *)0x0;
    }
    else {
      local_d8 = (parser->tokens).head;
    }
    anchor = (yaml_char_t *)local_d8;
    if (local_d8 == (yaml_token_t *)0x0) goto LAB_00108a38;
    if (local_d8->type == YAML_TAG_TOKEN) {
      tag_suffix = (local_d8->data).tag.handle;
      tag = (local_d8->data).tag.suffix;
      sStack_98 = (local_d8->start_mark).index;
      tag_mark.index = (local_d8->start_mark).line;
      tag_mark.line = (local_d8->start_mark).column;
      tag_mark.column = (local_d8->end_mark).index;
      end_mark.index = (local_d8->end_mark).line;
      end_mark.line = (local_d8->end_mark).column;
      parser->token_available = 0;
      parser->tokens_parsed = parser->tokens_parsed + 1;
      parser->stream_end_produced = (uint)(((parser->tokens).head)->type == YAML_STREAM_END_TOKEN);
      (parser->tokens).head = (parser->tokens).head + 1;
      if ((parser->token_available == 0) &&
         (iVar5 = yaml_parser_fetch_more_tokens(parser), iVar5 == 0)) {
        local_e0 = (yaml_token_t *)0x0;
        anchor = (yaml_char_t *)local_e0;
      }
      else {
        anchor = (yaml_char_t *)(parser->tokens).head;
      }
joined_r0x001080ee:
      if ((yaml_token_t *)anchor == (yaml_token_t *)0x0) goto LAB_00108a38;
    }
  }
  else {
    end_mark.column = tag_mark.column;
    start_mark.index = end_mark.index;
    start_mark.line = end_mark.line;
    if (local_d0->type == YAML_TAG_TOKEN) {
      tag_suffix = (local_d0->data).tag.handle;
      tag = (local_d0->data).tag.suffix;
      sStack_98 = (local_d0->start_mark).index;
      tag_mark.index = (local_d0->start_mark).line;
      tag_mark.line = (local_d0->start_mark).column;
      tag_mark.column = (local_d0->end_mark).index;
      end_mark.index = (local_d0->end_mark).line;
      end_mark.line = (local_d0->end_mark).column;
      parser->token_available = 0;
      parser->tokens_parsed = parser->tokens_parsed + 1;
      parser->stream_end_produced = (uint)(((parser->tokens).head)->type == YAML_STREAM_END_TOKEN);
      (parser->tokens).head = (parser->tokens).head + 1;
      if ((parser->token_available == 0) &&
         (iVar5 = yaml_parser_fetch_more_tokens(parser), iVar5 == 0)) {
        local_e8 = (yaml_token_t *)0x0;
      }
      else {
        local_e8 = (parser->tokens).head;
      }
      anchor = (yaml_char_t *)local_e8;
      if (local_e8 == (yaml_token_t *)0x0) goto LAB_00108a38;
      end_mark.column = sStack_98;
      start_mark.index = tag_mark.index;
      start_mark.line = tag_mark.line;
      if (local_e8->type == YAML_ANCHOR_TOKEN) {
        tag_handle = (local_e8->data).tag.handle;
        tag_mark.column = (local_e8->end_mark).index;
        end_mark.index = (local_e8->end_mark).line;
        end_mark.line = (local_e8->end_mark).column;
        parser->token_available = 0;
        parser->tokens_parsed = parser->tokens_parsed + 1;
        parser->stream_end_produced = (uint)(((parser->tokens).head)->type == YAML_STREAM_END_TOKEN)
        ;
        (parser->tokens).head = (parser->tokens).head + 1;
        if ((parser->token_available == 0) &&
           (iVar5 = yaml_parser_fetch_more_tokens(parser), iVar5 == 0)) {
          local_f0 = (yaml_token_t *)0x0;
          anchor = (yaml_char_t *)local_f0;
        }
        else {
          anchor = (yaml_char_t *)(parser->tokens).head;
        }
        goto joined_r0x001080ee;
      }
    }
  }
  if (tag_suffix != (yaml_char_t *)0x0) {
    if (*tag_suffix == '\0') {
      start_mark.column = (size_t)tag;
      yaml_free(tag_suffix);
      tag = (yaml_char_t *)0x0;
      tag_suffix = (yaml_char_t *)0x0;
    }
    else {
      for (prefix_len = (size_t)(parser->tag_directives).start;
          (yaml_tag_directive_t *)prefix_len != (parser->tag_directives).top;
          prefix_len = prefix_len + 0x10) {
        iVar5 = strcmp(*(char **)prefix_len,(char *)tag_suffix);
        if (iVar5 == 0) {
          __n = strlen(*(char **)(prefix_len + 8));
          __n_00 = strlen((char *)tag);
          start_mark.column = (size_t)yaml_malloc(__n + __n_00 + 1);
          if ((void *)start_mark.column == (void *)0x0) {
            parser->error = YAML_MEMORY_ERROR;
            goto LAB_00108a38;
          }
          memcpy((void *)start_mark.column,*(void **)(prefix_len + 8),__n);
          memcpy((void *)(start_mark.column + __n),tag,__n_00);
          *(undefined1 *)(start_mark.column + __n + __n_00) = 0;
          yaml_free(tag_suffix);
          yaml_free(tag);
          tag = (yaml_char_t *)0x0;
          tag_suffix = (yaml_char_t *)0x0;
          break;
        }
      }
      if (start_mark.column == 0) {
        context_mark.line = start_mark.index;
        context_mark.index = end_mark.column;
        context_mark.column = start_mark.line;
        problem_mark.line = tag_mark.index;
        problem_mark.index = sStack_98;
        problem_mark.column = tag_mark.line;
        yaml_parser_set_parser_error_context
                  (parser,"while parsing a node",context_mark,"found undefined tag handle",
                   problem_mark);
        goto LAB_00108a38;
      }
    }
  }
  local_f1 = 1;
  if (start_mark.column != 0) {
    local_f1 = *(char *)start_mark.column != '\0' ^ 0xff;
  }
  uVar6 = (uint)(local_f1 & 1);
  if ((indentless_sequence != 0) && (*(int *)anchor == 0xe)) {
    sVar2 = *(size_t *)(anchor + 0x38);
    sVar3 = *(size_t *)(anchor + 0x40);
    sVar4 = *(size_t *)(anchor + 0x48);
    parser->state = YAML_PARSE_INDENTLESS_SEQUENCE_ENTRY_STATE;
    memset(event,0,0x68);
    event->type = YAML_SEQUENCE_START_EVENT;
    (event->start_mark).index = end_mark.column;
    (event->start_mark).line = start_mark.index;
    (event->start_mark).column = start_mark.line;
    (event->end_mark).index = sVar2;
    (event->end_mark).line = sVar3;
    (event->end_mark).column = sVar4;
    (event->data).scalar.anchor = tag_handle;
    (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)start_mark.column;
    (event->data).sequence_start.implicit = uVar6;
    (event->data).sequence_start.style = YAML_BLOCK_SEQUENCE_STYLE;
    return 1;
  }
  if (*(int *)anchor == 0x15) {
    value._4_4_ = 0;
    value._0_4_ = 0;
    sVar2 = *(size_t *)(anchor + 0x38);
    sVar3 = *(size_t *)(anchor + 0x40);
    sVar4 = *(size_t *)(anchor + 0x48);
    if (((*(int *)(anchor + 0x18) == 1) && (start_mark.column == 0)) ||
       ((start_mark.column != 0 && (iVar5 = strcmp((char *)start_mark.column,"!"), iVar5 == 0)))) {
      value._4_4_ = 1;
    }
    else {
      value._0_4_ = (uint)(start_mark.column == 0);
    }
    pyVar1 = (parser->states).top;
    (parser->states).top = pyVar1 + -1;
    parser->state = pyVar1[-1];
    memset(event,0,0x68);
    event->type = YAML_SCALAR_EVENT;
    (event->start_mark).index = end_mark.column;
    (event->start_mark).line = start_mark.index;
    (event->start_mark).column = start_mark.line;
    (event->end_mark).index = sVar2;
    (event->end_mark).line = sVar3;
    (event->end_mark).column = sVar4;
    (event->data).scalar.anchor = tag_handle;
    (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)start_mark.column;
    (event->data).document_start.tag_directives.end = *(yaml_tag_directive_t **)(anchor + 8);
    (event->data).scalar.length = *(size_t *)(anchor + 0x10);
    (event->data).scalar.plain_implicit = value._4_4_;
    (event->data).scalar.quoted_implicit = (uint)value;
    (event->data).scalar.style = *(yaml_scalar_style_t *)(anchor + 0x18);
    parser->token_available = 0;
    parser->tokens_parsed = parser->tokens_parsed + 1;
    parser->stream_end_produced = (uint)(((parser->tokens).head)->type == YAML_STREAM_END_TOKEN);
    (parser->tokens).head = (parser->tokens).head + 1;
    return 1;
  }
  if (*(int *)anchor == 10) {
    sVar2 = *(size_t *)(anchor + 0x38);
    sVar3 = *(size_t *)(anchor + 0x40);
    sVar4 = *(size_t *)(anchor + 0x48);
    parser->state = YAML_PARSE_FLOW_SEQUENCE_FIRST_ENTRY_STATE;
    memset(event,0,0x68);
    event->type = YAML_SEQUENCE_START_EVENT;
    (event->start_mark).index = end_mark.column;
    (event->start_mark).line = start_mark.index;
    (event->start_mark).column = start_mark.line;
    (event->end_mark).index = sVar2;
    (event->end_mark).line = sVar3;
    (event->end_mark).column = sVar4;
    (event->data).scalar.anchor = tag_handle;
    (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)start_mark.column;
    (event->data).sequence_start.implicit = uVar6;
    (event->data).sequence_start.style = YAML_FLOW_SEQUENCE_STYLE;
    return 1;
  }
  if (*(int *)anchor == 0xc) {
    sVar2 = *(size_t *)(anchor + 0x38);
    sVar3 = *(size_t *)(anchor + 0x40);
    sVar4 = *(size_t *)(anchor + 0x48);
    parser->state = YAML_PARSE_FLOW_MAPPING_FIRST_KEY_STATE;
    memset(event,0,0x68);
    event->type = YAML_MAPPING_START_EVENT;
    (event->start_mark).index = end_mark.column;
    (event->start_mark).line = start_mark.index;
    (event->start_mark).column = start_mark.line;
    (event->end_mark).index = sVar2;
    (event->end_mark).line = sVar3;
    (event->end_mark).column = sVar4;
    (event->data).scalar.anchor = tag_handle;
    (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)start_mark.column;
    (event->data).sequence_start.implicit = uVar6;
    (event->data).sequence_start.style = YAML_FLOW_SEQUENCE_STYLE;
    return 1;
  }
  if ((block != 0) && (*(int *)anchor == 7)) {
    sVar2 = *(size_t *)(anchor + 0x38);
    sVar3 = *(size_t *)(anchor + 0x40);
    sVar4 = *(size_t *)(anchor + 0x48);
    parser->state = YAML_PARSE_BLOCK_SEQUENCE_FIRST_ENTRY_STATE;
    memset(event,0,0x68);
    event->type = YAML_SEQUENCE_START_EVENT;
    (event->start_mark).index = end_mark.column;
    (event->start_mark).line = start_mark.index;
    (event->start_mark).column = start_mark.line;
    (event->end_mark).index = sVar2;
    (event->end_mark).line = sVar3;
    (event->end_mark).column = sVar4;
    (event->data).scalar.anchor = tag_handle;
    (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)start_mark.column;
    (event->data).sequence_start.implicit = uVar6;
    (event->data).sequence_start.style = YAML_BLOCK_SEQUENCE_STYLE;
    return 1;
  }
  if ((block != 0) && (*(int *)anchor == 8)) {
    sVar2 = *(size_t *)(anchor + 0x38);
    sVar3 = *(size_t *)(anchor + 0x40);
    sVar4 = *(size_t *)(anchor + 0x48);
    parser->state = YAML_PARSE_BLOCK_MAPPING_FIRST_KEY_STATE;
    memset(event,0,0x68);
    event->type = YAML_MAPPING_START_EVENT;
    (event->start_mark).index = end_mark.column;
    (event->start_mark).line = start_mark.index;
    (event->start_mark).column = start_mark.line;
    (event->end_mark).index = sVar2;
    (event->end_mark).line = sVar3;
    (event->end_mark).column = sVar4;
    (event->data).scalar.anchor = tag_handle;
    (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)start_mark.column;
    (event->data).sequence_start.implicit = uVar6;
    (event->data).sequence_start.style = YAML_BLOCK_SEQUENCE_STYLE;
    return 1;
  }
  if ((tag_handle == (yaml_char_t *)0x0) && (start_mark.column == 0)) {
    context = "while parsing a flow node";
    if (block != 0) {
      context = "while parsing a block node";
    }
    context_mark_00.line = start_mark.index;
    context_mark_00.index = end_mark.column;
    context_mark_00.column = start_mark.line;
    yaml_parser_set_parser_error_context
              (parser,context,context_mark_00,"did not find expected node content",
               *(yaml_mark_t *)(anchor + 0x20));
  }
  else {
    pyVar7 = (yaml_char_t *)yaml_malloc(1);
    if (pyVar7 != (yaml_char_t *)0x0) {
      *pyVar7 = '\0';
      pyVar1 = (parser->states).top;
      (parser->states).top = pyVar1 + -1;
      parser->state = pyVar1[-1];
      memset(event,0,0x68);
      event->type = YAML_SCALAR_EVENT;
      (event->start_mark).index = end_mark.column;
      (event->start_mark).line = start_mark.index;
      (event->start_mark).column = start_mark.line;
      (event->end_mark).index = tag_mark.column;
      (event->end_mark).line = end_mark.index;
      (event->end_mark).column = end_mark.line;
      (event->data).scalar.anchor = tag_handle;
      (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)start_mark.column;
      (event->data).scalar.value = pyVar7;
      (event->data).scalar.length = 0;
      (event->data).scalar.plain_implicit = uVar6;
      (event->data).scalar.quoted_implicit = 0;
      (event->data).scalar.style = YAML_PLAIN_SCALAR_STYLE;
      return 1;
    }
    parser->error = YAML_MEMORY_ERROR;
  }
LAB_00108a38:
  yaml_free(tag_handle);
  yaml_free(tag_suffix);
  yaml_free(tag);
  yaml_free((void *)start_mark.column);
  return 0;
}

Assistant:

static int
yaml_parser_parse_node(yaml_parser_t *parser, yaml_event_t *event,
        int block, int indentless_sequence)
{
    yaml_token_t *token;
    yaml_char_t *anchor = NULL;
    yaml_char_t *tag_handle = NULL;
    yaml_char_t *tag_suffix = NULL;
    yaml_char_t *tag = NULL;
    yaml_mark_t start_mark, end_mark, tag_mark;
    int implicit;

    token = PEEK_TOKEN(parser);
    if (!token) return 0;

    if (token->type == YAML_ALIAS_TOKEN)
    {
        parser->state = POP(parser, parser->states);
        ALIAS_EVENT_INIT(*event, token->data.alias.value,
                token->start_mark, token->end_mark);
        SKIP_TOKEN(parser);
        return 1;
    }

    else
    {
        start_mark = end_mark = token->start_mark;

        if (token->type == YAML_ANCHOR_TOKEN)
        {
            anchor = token->data.anchor.value;
            start_mark = token->start_mark;
            end_mark = token->end_mark;
            SKIP_TOKEN(parser);
            token = PEEK_TOKEN(parser);
            if (!token) goto error;
            if (token->type == YAML_TAG_TOKEN)
            {
                tag_handle = token->data.tag.handle;
                tag_suffix = token->data.tag.suffix;
                tag_mark = token->start_mark;
                end_mark = token->end_mark;
                SKIP_TOKEN(parser);
                token = PEEK_TOKEN(parser);
                if (!token) goto error;
            }
        }
        else if (token->type == YAML_TAG_TOKEN)
        {
            tag_handle = token->data.tag.handle;
            tag_suffix = token->data.tag.suffix;
            start_mark = tag_mark = token->start_mark;
            end_mark = token->end_mark;
            SKIP_TOKEN(parser);
            token = PEEK_TOKEN(parser);
            if (!token) goto error;
            if (token->type == YAML_ANCHOR_TOKEN)
            {
                anchor = token->data.anchor.value;
                end_mark = token->end_mark;
                SKIP_TOKEN(parser);
                token = PEEK_TOKEN(parser);
                if (!token) goto error;
            }
        }

        if (tag_handle) {
            if (!*tag_handle) {
                tag = tag_suffix;
                yaml_free(tag_handle);
                tag_handle = tag_suffix = NULL;
            }
            else {
                yaml_tag_directive_t *tag_directive;
                for (tag_directive = parser->tag_directives.start;
                        tag_directive != parser->tag_directives.top;
                        tag_directive ++) {
                    if (strcmp((char *)tag_directive->handle, (char *)tag_handle) == 0) {
                        size_t prefix_len = strlen((char *)tag_directive->prefix);
                        size_t suffix_len = strlen((char *)tag_suffix);
                        tag = YAML_MALLOC(prefix_len+suffix_len+1);
                        if (!tag) {
                            parser->error = YAML_MEMORY_ERROR;
                            goto error;
                        }
                        memcpy(tag, tag_directive->prefix, prefix_len);
                        memcpy(tag+prefix_len, tag_suffix, suffix_len);
                        tag[prefix_len+suffix_len] = '\0';
                        yaml_free(tag_handle);
                        yaml_free(tag_suffix);
                        tag_handle = tag_suffix = NULL;
                        break;
                    }
                }
                if (!tag) {
                    yaml_parser_set_parser_error_context(parser,
                            "while parsing a node", start_mark,
                            "found undefined tag handle", tag_mark);
                    goto error;
                }
            }
        }

        implicit = (!tag || !*tag);
        if (indentless_sequence && token->type == YAML_BLOCK_ENTRY_TOKEN) {
            end_mark = token->end_mark;
            parser->state = YAML_PARSE_INDENTLESS_SEQUENCE_ENTRY_STATE;
            SEQUENCE_START_EVENT_INIT(*event, anchor, tag, implicit,
                    YAML_BLOCK_SEQUENCE_STYLE, start_mark, end_mark);
            return 1;
        }
        else {
            if (token->type == YAML_SCALAR_TOKEN) {
                int plain_implicit = 0;
                int quoted_implicit = 0;
                end_mark = token->end_mark;
                if ((token->data.scalar.style == YAML_PLAIN_SCALAR_STYLE && !tag)
                        || (tag && strcmp((char *)tag, "!") == 0)) {
                    plain_implicit = 1;
                }
                else if (!tag) {
                    quoted_implicit = 1;
                }
                parser->state = POP(parser, parser->states);
                SCALAR_EVENT_INIT(*event, anchor, tag,
                        token->data.scalar.value, token->data.scalar.length,
                        plain_implicit, quoted_implicit,
                        token->data.scalar.style, start_mark, end_mark);
                SKIP_TOKEN(parser);
                return 1;
            }
            else if (token->type == YAML_FLOW_SEQUENCE_START_TOKEN) {
                end_mark = token->end_mark;
                parser->state = YAML_PARSE_FLOW_SEQUENCE_FIRST_ENTRY_STATE;
                SEQUENCE_START_EVENT_INIT(*event, anchor, tag, implicit,
                        YAML_FLOW_SEQUENCE_STYLE, start_mark, end_mark);
                return 1;
            }
            else if (token->type == YAML_FLOW_MAPPING_START_TOKEN) {
                end_mark = token->end_mark;
                parser->state = YAML_PARSE_FLOW_MAPPING_FIRST_KEY_STATE;
                MAPPING_START_EVENT_INIT(*event, anchor, tag, implicit,
                        YAML_FLOW_MAPPING_STYLE, start_mark, end_mark);
                return 1;
            }
            else if (block && token->type == YAML_BLOCK_SEQUENCE_START_TOKEN) {
                end_mark = token->end_mark;
                parser->state = YAML_PARSE_BLOCK_SEQUENCE_FIRST_ENTRY_STATE;
                SEQUENCE_START_EVENT_INIT(*event, anchor, tag, implicit,
                        YAML_BLOCK_SEQUENCE_STYLE, start_mark, end_mark);
                return 1;
            }
            else if (block && token->type == YAML_BLOCK_MAPPING_START_TOKEN) {
                end_mark = token->end_mark;
                parser->state = YAML_PARSE_BLOCK_MAPPING_FIRST_KEY_STATE;
                MAPPING_START_EVENT_INIT(*event, anchor, tag, implicit,
                        YAML_BLOCK_MAPPING_STYLE, start_mark, end_mark);
                return 1;
            }
            else if (anchor || tag) {
                yaml_char_t *value = YAML_MALLOC(1);
                if (!value) {
                    parser->error = YAML_MEMORY_ERROR;
                    goto error;
                }
                value[0] = '\0';
                parser->state = POP(parser, parser->states);
                SCALAR_EVENT_INIT(*event, anchor, tag, value, 0,
                        implicit, 0, YAML_PLAIN_SCALAR_STYLE,
                        start_mark, end_mark);
                return 1;
            }
            else {
                yaml_parser_set_parser_error_context(parser,
                        (block ? "while parsing a block node"
                         : "while parsing a flow node"), start_mark,
                        "did not find expected node content", token->start_mark);
                goto error;
            }
        }
    }

error:
    yaml_free(anchor);
    yaml_free(tag_handle);
    yaml_free(tag_suffix);
    yaml_free(tag);

    return 0;
}